

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core_write.cpp
# Opt level: O3

UniValue * ValueFromAmount(UniValue *__return_storage_ptr__,CAmount amount)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *in_R9;
  long in_FS_OFFSET;
  int64_t remainder;
  int64_t quotient;
  char *local_50;
  long local_48;
  char *local_40;
  string local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = (char *)(amount / 100000000);
  local_48 = amount % 100000000;
  if (amount < 0) {
    local_40 = (char *)-(long)local_40;
    local_48 = -local_48;
    local_50 = "-";
  }
  else {
    local_50 = "";
  }
  tinyformat::format<char_const*,long,long>
            (&local_38,(tinyformat *)"%s%d.%08d",(char *)&local_50,&local_40,&local_48,in_R9);
  __return_storage_ptr__->typ = VNUM;
  paVar1 = &(__return_storage_ptr__->val).field_2;
  (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p == &local_38.field_2) {
    paVar1->_M_allocated_capacity = local_38.field_2._M_allocated_capacity;
    *(undefined8 *)((long)&(__return_storage_ptr__->val).field_2 + 8) = local_38.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->val)._M_dataplus._M_p = local_38._M_dataplus._M_p;
    (__return_storage_ptr__->val).field_2._M_allocated_capacity =
         local_38.field_2._M_allocated_capacity;
  }
  (__return_storage_ptr__->val)._M_string_length = local_38._M_string_length;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue ValueFromAmount(const CAmount amount)
{
    static_assert(COIN > 1);
    int64_t quotient = amount / COIN;
    int64_t remainder = amount % COIN;
    if (amount < 0) {
        quotient = -quotient;
        remainder = -remainder;
    }
    return UniValue(UniValue::VNUM,
            strprintf("%s%d.%08d", amount < 0 ? "-" : "", quotient, remainder));
}